

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_bind_state.cpp
# Opt level: O1

void __thiscall duckdb::SelectBindState::AddExpandedColumn(SelectBindState *this,idx_t expand_count)

{
  vector<unsigned_long,_true> *this_00;
  iterator iVar1;
  reference pvVar2;
  unsigned_long local_20;
  
  this_00 = &this->expanded_column_indices;
  iVar1._M_current =
       (this->expanded_column_indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((this->expanded_column_indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start == iVar1._M_current) {
    local_20 = 0;
    if (iVar1._M_current ==
        (this->expanded_column_indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,iVar1,&local_20);
    }
    else {
      *iVar1._M_current = 0;
      (this->expanded_column_indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  pvVar2 = vector<unsigned_long,_true>::back(this_00);
  local_20 = expand_count + *pvVar2;
  iVar1._M_current =
       (this->expanded_column_indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->expanded_column_indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,iVar1,&local_20);
  }
  else {
    *iVar1._M_current = local_20;
    (this->expanded_column_indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  return;
}

Assistant:

void SelectBindState::AddExpandedColumn(idx_t expand_count) {
	if (expanded_column_indices.empty()) {
		expanded_column_indices.push_back(0);
	}
	expanded_column_indices.push_back(expanded_column_indices.back() + expand_count);
}